

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

vector<despot::State_*,_std::allocator<despot::State_*>_> * __thiscall
despot::BaseRockSample::InitialParticleSet
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,
          BaseRockSample *this)

{
  value_type local_50;
  value_type local_48;
  RockSampleState *rockstate;
  int n;
  undefined8 local_30;
  int local_24;
  int local_20;
  int pos;
  int N;
  BaseRockSample *this_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles;
  
  pos._3_1_ = 0;
  _N = this;
  this_local = (BaseRockSample *)__return_storage_ptr__;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(__return_storage_ptr__);
  local_20 = 1 << ((byte)this->num_rocks_ & 0x1f);
  local_30 = *(undefined8 *)&this->start_pos_;
  local_24 = CoordToIndex(this,local_30);
  local_24 = local_24 * (1 << ((byte)this->num_rocks_ & 0x1f));
  for (rockstate._0_4_ = 0; (int)rockstate < local_20; rockstate._0_4_ = (int)rockstate + 1) {
    local_50 = (value_type)
               (**(code **)(*(long *)this + 0xb8))
                         (1.0 / (double)local_20,this,(int)rockstate + local_24);
    local_48 = local_50;
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
              (__return_storage_ptr__,&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<State*> BaseRockSample::InitialParticleSet() const {
	vector<State*> particles;
	int N = 1 << num_rocks_, pos = CoordToIndex(start_pos_) * (1 << num_rocks_);
	for (int n = 0; n < N; n++) {
		RockSampleState* rockstate = static_cast<RockSampleState*>(Allocate(
			n + pos, 1.0 / N));
		particles.push_back(rockstate);
	}
	return particles;
}